

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<640,Blob<256>>
               (hashfunc<Blob<256>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  pfHash p_Var2;
  reference pvVar3;
  size_type sVar4;
  byte in_CL;
  uint in_EDX;
  char *pcVar5;
  uint in_ESI;
  byte in_R8B;
  byte in_R9B;
  bool result;
  keytype k;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> hashes;
  undefined4 in_stack_ffffffffffffff78;
  byte bVar6;
  undefined4 in_stack_ffffffffffffff7c;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> *in_stack_ffffffffffffff80;
  Blob<640> *in_stack_ffffffffffffff88;
  uint8_t in_stack_ffffffffffffff97;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  pfHash in_stack_ffffffffffffffa0;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> local_28;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  hashfunc local_8 [8];
  
  local_d = (byte)in_EDX & 1;
  local_e = in_CL & 1;
  local_f = in_R8B & 1;
  local_10 = in_R9B & 1;
  pcVar5 = "exactly";
  if ((in_EDX & 1) != 0) {
    pcVar5 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x280,pcVar5,(ulong)in_ESI);
  std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::vector
            ((vector<Blob<256>,_std::allocator<Blob<256>_>_> *)0x19d09f);
  Blob<640>::Blob((Blob<640> *)&stack0xffffffffffffff88);
  memset(&stack0xffffffffffffff88,0,0x50);
  if ((local_d & 1) != 0) {
    std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::resize
              (in_stack_ffffffffffffff80,
               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    p_Var2 = hashfunc::operator_cast_to_function_pointer(local_8);
    pvVar3 = std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::operator[](&local_28,0);
    (*p_Var2)(&stack0xffffffffffffff88,0x50,0,pvVar3);
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<640>,Blob<256>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
             (bool)in_stack_ffffffffffffff97,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  sVar4 = std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::size(&local_28);
  printf("%d keys\n",sVar4 & 0xffffffff);
  bVar6 = 1;
  bVar1 = TestHashList<Blob<256>>
                    ((vector<Blob<256>,_std::allocator<Blob<256>_>_> *)k.bytes._64_8_,
                     (bool)k.bytes[0x3f],(bool)k.bytes[0x3e],(bool)k.bytes[0x3d],(bool)k.bytes[0x3c]
                     ,(bool)k.bytes[0x3b]);
  bVar6 = bVar1 & bVar6;
  printf("\n");
  std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::~vector
            ((vector<Blob<256>,_std::allocator<Blob<256>_>_> *)CONCAT44(in_ESI,in_EDX));
  return (bool)(bVar6 & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive,
                     bool testColl, bool testDist, bool drawDiagram )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits,
         inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashes.resize(1);
    hash(&k,sizeof(keytype),0,&hashes[0]);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}